

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RandSequenceStatementSyntax *syntax)

{
  bool bVar1;
  SourceLocation loc_00;
  _Optional_payload_base<slang::ast::VariableLifetime> lifetime;
  Scope *scope_00;
  StatementBlockSymbol *pSVar2;
  reference ppPVar3;
  Scope *in_RSI;
  span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL> *in_RDI;
  RandSeqProductionSymbol *symbol;
  ProductionSyntax *prod;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::ProductionSyntax> *__range2;
  StatementBlockSymbol *result;
  type *loc;
  type *name;
  SyntaxNode *in_stack_00000598;
  Scope *in_stack_000005a0;
  VariableLifetime *in_stack_ffffffffffffff38;
  Scope *this;
  string_view local_a0;
  ProductionSyntax *local_90;
  StatementSyntax *in_stack_ffffffffffffff78;
  __normal_iterator<slang::syntax::ProductionSyntax_**,_std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffff80;
  Symbol *local_68;
  StatementBlockKind blockKind;
  StatementSyntax *in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffd8;
  
  this = in_RSI;
  loc_00 = parsing::Token::location((Token *)&in_RSI[1].lastMember);
  getLabel(in_stack_ffffffffffffff78,(SourceLocation)in_stack_ffffffffffffff80._M_current);
  lifetime = (_Optional_payload_base<slang::ast::VariableLifetime>)
             std::get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                         *)0x3e7dd4);
  scope_00 = (Scope *)std::
                      get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                                  *)0x3e7de9);
  blockKind = (StatementBlockKind)((ulong)*(char **)((long)lifetime + 8) >> 0x20);
  std::optional<slang::ast::VariableLifetime>::optional<slang::ast::VariableLifetime,_true>
            ((optional<slang::ast::VariableLifetime> *)this,in_stack_ffffffffffffff38);
  pSVar2 = createBlock(scope_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffd8,loc_00,blockKind
                       ,(optional<slang::ast::VariableLifetime>)lifetime);
  std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL> *)local_68);
  std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>::end(in_RDI);
  while (bVar1 = __gnu_cxx::
                 operator==<slang::syntax::ProductionSyntax_**,_std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::ProductionSyntax_**,_std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>_>
                             *)this,(__normal_iterator<slang::syntax::ProductionSyntax_**,_std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>_>
                                     *)local_68), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppPVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::ProductionSyntax_**,_std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::ProductionSyntax_**,_std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffff80);
    local_90 = *ppPVar3;
    if ((local_90->super_SyntaxNode).previewNode != (SyntaxNode *)0x0) {
      Scope::addMembers(in_stack_000005a0,in_stack_00000598);
    }
    local_a0 = parsing::Token::valueText((Token *)in_RSI);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_a0);
    if (!bVar1) {
      RandSeqProductionSymbol::fromSyntax((Scope *)__end2._M_current,prod);
      Scope::addMember(this,local_68);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::ProductionSyntax_**,_std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::ProductionSyntax_**,_std::span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffff80);
  }
  return pSVar2;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RandSequenceStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.randsequence.location());
    auto result = createBlock(scope, syntax, name, loc, StatementBlockKind::Sequential,
                              VariableLifetime::Automatic);

    for (auto prod : syntax.productions) {
        if (prod->previewNode)
            result->addMembers(*prod->previewNode);

        if (prod->name.valueText().empty())
            continue;

        auto& symbol = RandSeqProductionSymbol::fromSyntax(scope, *prod);
        result->addMember(symbol);
    }

    return *result;
}